

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O1

REF_STATUS ref_grid_parse_unit(REF_GRID ref_grid,char *unit)

{
  int iVar1;
  REF_GRID_UNIT RVar2;
  REF_GRID_UNIT RVar3;
  
  ref_grid->unit = REF_GRID_UNIT_LAST;
  iVar1 = strcmp("in",unit);
  RVar2 = (uint)(iVar1 != 0) << 2;
  ref_grid->unit = RVar2;
  iVar1 = strcmp("ft",unit);
  if (iVar1 == 0) {
    RVar2 = REF_GRID_FT;
  }
  ref_grid->unit = RVar2;
  iVar1 = strcmp("m",unit);
  RVar3 = REF_GRID_M;
  if (iVar1 != 0) {
    RVar3 = RVar2;
  }
  ref_grid->unit = RVar3;
  iVar1 = strcmp("cm",unit);
  RVar2 = REF_GRID_CM;
  if (iVar1 != 0) {
    RVar2 = RVar3;
  }
  ref_grid->unit = RVar2;
  if (RVar2 == REF_GRID_UNIT_LAST) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0xed,
           "ref_grid_parse_unit","mesh_units not recognized");
  }
  return (uint)(RVar2 == REF_GRID_UNIT_LAST);
}

Assistant:

REF_FCN REF_STATUS ref_grid_parse_unit(REF_GRID ref_grid, const char *unit) {
  ref_grid_unit(ref_grid) = REF_GRID_UNIT_LAST;
  if (0 == strcmp("in", unit)) ref_grid_unit(ref_grid) = REF_GRID_IN;
  if (0 == strcmp("ft", unit)) ref_grid_unit(ref_grid) = REF_GRID_FT;
  if (0 == strcmp("m", unit)) ref_grid_unit(ref_grid) = REF_GRID_M;
  if (0 == strcmp("cm", unit)) ref_grid_unit(ref_grid) = REF_GRID_CM;
  RUS(REF_GRID_UNIT_LAST, ref_grid_unit(ref_grid), "mesh_units not recognized");
  return REF_SUCCESS;
}